

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

int __thiscall Fl_Function_Type::open(Fl_Function_Type *this,char *__file,int __oflag,...)

{
  Fl_Choice *pFVar1;
  Fl_Menu_Item *pFVar2;
  char cVar3;
  int iVar4;
  Fl_Button *pFVar5;
  char *pcVar6;
  Fl_Function_Type *__s1;
  char *pcVar7;
  Fl_Choice **ppFVar8;
  _func_int **pp_Var9;
  uint uVar10;
  Fl_Function_Type *pFVar11;
  Fl_Function_Type *pFVar12;
  Fl_Choice **ppFVar13;
  bool bVar14;
  _func_int **local_40;
  char **local_38;
  
  if (function_panel == (Fl_Double_Window *)0x0) {
    make_function_panel();
  }
  local_38 = &this->return_type;
  Fl_Input_::static_value(&f_return_type_input->super_Fl_Input_,this->return_type);
  Fl_Input_::static_value(&f_name_input->super_Fl_Input_,(this->super_Fl_Type).name_);
  pFVar12 = this;
  do {
    pFVar12 = (Fl_Function_Type *)(pFVar12->super_Fl_Type).parent;
    if (pFVar12 == (Fl_Function_Type *)0x0) goto LAB_00178c54;
    iVar4 = (*(pFVar12->super_Fl_Type)._vptr_Fl_Type[0x26])(pFVar12);
  } while (iVar4 == 0);
  if (pFVar12 == (Fl_Function_Type *)0x0) {
LAB_00178c54:
    ppFVar8 = &f_public_choice;
    Fl_Choice::value(f_public_choice,(uint)('\0' < this->public_));
    ppFVar13 = &f_public_member_choice;
  }
  else {
    ppFVar8 = &f_public_member_choice;
    Fl_Choice::value(f_public_member_choice,(int)this->public_);
    ppFVar13 = &f_public_choice;
  }
  (*((*ppFVar8)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar13)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  Fl_Button::value(&f_c_button->super_Fl_Button,(int)this->cdecl_);
  pcVar6 = (this->super_Fl_Type).comment_;
  pcVar7 = "";
  if (pcVar6 != (char *)0x0) {
    pcVar7 = pcVar6;
  }
  Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer,pcVar7);
  pFVar12 = (Fl_Function_Type *)function_panel;
  (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  pcVar6 = (char *)0x0;
  do {
    if (pcVar6 != (char *)0x0) {
      pFVar12 = (Fl_Function_Type *)0x21900d;
      fl_alert("%s");
    }
    do {
      pFVar5 = (Fl_Button *)Fl::readqueue();
      if (pFVar5 == f_panel_cancel) {
        iVar4 = 6;
      }
      else if (pFVar5 == &f_panel_ok->super_Fl_Button) {
        iVar4 = 4;
      }
      else {
        iVar4 = 0;
        if (pFVar5 == (Fl_Button *)0x0) {
          Fl::wait(pFVar12);
          iVar4 = 0;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 == 6) break;
    pcVar7 = (f_name_input->super_Fl_Input_).value_;
    pp_Var9 = (_func_int **)(pcVar7 + -1);
    do {
      pcVar7 = pcVar7 + 1;
      pcVar6 = (char *)((long)pp_Var9 + 1);
      pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      iVar4 = isspace((int)*pcVar6);
    } while (iVar4 != 0);
    pFVar12 = (Fl_Function_Type *)&stack0xffffffffffffffc0;
    local_40 = pp_Var9;
    pcVar6 = _c_check((char **)pFVar12,0);
    if (pcVar6 == (char *)0x0) {
      cVar3 = *(char *)pp_Var9;
      uVar10 = (uint)cVar3;
      bVar14 = uVar10 == 0x28;
      if (!bVar14) {
        pFVar12 = (Fl_Function_Type *)(ulong)uVar10;
        iVar4 = isspace(uVar10);
        if (cVar3 != '\0') {
          while (iVar4 == 0) {
            cVar3 = *pcVar7;
            uVar10 = (uint)cVar3;
            bVar14 = uVar10 == 0x28;
            if (bVar14) break;
            pFVar12 = (Fl_Function_Type *)(ulong)uVar10;
            iVar4 = isspace(uVar10);
            if (cVar3 == '\0') break;
            pcVar7 = pcVar7 + 1;
          }
        }
      }
      if ((!bVar14) && (*(char *)pp_Var9 != '\0')) {
        pcVar6 = "must be name(arguments), try again:";
        goto LAB_00178dad;
      }
      pp_Var9 = (_func_int **)(f_return_type_input->super_Fl_Input_).value_;
      pFVar12 = (Fl_Function_Type *)&stack0xffffffffffffffc0;
      local_40 = pp_Var9;
      pcVar6 = _c_check((char **)pFVar12,0);
      if (pcVar6 != (char *)0x0) goto LAB_00178dad;
      Fl_Type::name(&this->super_Fl_Type,(f_name_input->super_Fl_Input_).value_);
      storestring((char *)pp_Var9,local_38,0);
      pFVar12 = this;
      do {
        pFVar12 = (Fl_Function_Type *)(pFVar12->super_Fl_Type).parent;
        if (pFVar12 == (Fl_Function_Type *)0x0) goto LAB_00178e79;
        iVar4 = (*(pFVar12->super_Fl_Type)._vptr_Fl_Type[0x26])(pFVar12);
      } while (iVar4 == 0);
      if (pFVar12 == (Fl_Function_Type *)0x0) {
LAB_00178e79:
        ppFVar8 = &f_public_choice;
      }
      else {
        ppFVar8 = &f_public_member_choice;
      }
      pFVar1 = *ppFVar8;
      pFVar2 = (pFVar1->super_Fl_Menu_).value_;
      if (pFVar2 == (Fl_Menu_Item *)0x0) {
        iVar4 = -1;
      }
      else {
        iVar4 = (int)((ulong)((long)pFVar2 - (long)(pFVar1->super_Fl_Menu_).menu_) >> 3) *
                -0x49249249;
      }
      if (iVar4 == this->public_) {
        bVar14 = false;
      }
      else {
        if (pFVar2 == (Fl_Menu_Item *)0x0) {
          cVar3 = -1;
        }
        else {
          cVar3 = (char)((uint)((int)pFVar2 - *(int *)&(pFVar1->super_Fl_Menu_).menu_) >> 3) * -0x49
          ;
        }
        this->public_ = cVar3;
        redraw_browser();
        bVar14 = true;
      }
      cVar3 = (f_c_button->super_Fl_Button).value_;
      if (this->cdecl_ != cVar3) {
        this->cdecl_ = cVar3;
        bVar14 = true;
      }
      __s1 = (Fl_Function_Type *)
             Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer);
      if ((__s1 == (Fl_Function_Type *)0x0) ||
         (*(char *)&(((Fl_Window *)&__s1->super_Fl_Type)->super_Fl_Group).super_Fl_Widget.
                    _vptr_Fl_Widget == '\0')) {
        if ((this->super_Fl_Type).comment_ != (char *)0x0) {
          redraw_browser();
        }
        pFVar11 = (Fl_Function_Type *)0x0;
      }
      else {
        pcVar7 = (this->super_Fl_Type).comment_;
        pFVar11 = __s1;
        if ((pcVar7 == (char *)0x0) || (iVar4 = strcmp((char *)__s1,pcVar7), iVar4 != 0)) {
          redraw_browser();
        }
      }
      pFVar12 = this;
      Fl_Type::comment(&this->super_Fl_Type,(char *)pFVar11);
      if (__s1 != (Fl_Function_Type *)0x0) {
        free(__s1);
        pFVar12 = __s1;
      }
      if (bVar14) {
        pFVar12 = (Fl_Function_Type *)&DAT_00000001;
        set_modflag(1);
      }
      bVar14 = false;
    }
    else {
LAB_00178dad:
      bVar14 = true;
    }
  } while (bVar14);
  iVar4 = (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar4;
}

Assistant:

void Fl_Function_Type::open() {
  if (!function_panel) make_function_panel();
  f_return_type_input->static_value(return_type);
  f_name_input->static_value(name());
  if (is_in_class()) {
    f_public_member_choice->value(public_);
    f_public_member_choice->show();
    f_public_choice->hide();
  } else {
    f_public_choice->value(public_>0);
    f_public_choice->show();
    f_public_member_choice->hide();
  }
  f_c_button->value(cdecl_);
  const char *c = comment();
  f_comment_input->buffer()->text(c?c:"");
  function_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == f_panel_cancel) goto BREAK2;
      else if (w == f_panel_ok) break;
      else if (!w) Fl::wait();
    }
    const char*c = f_name_input->value();
    while (isspace(*c)) c++;
    message = c_check(c); if (message) continue;
    const char *d = c;
    for (; *d != '('; d++) if (isspace(*d) || !*d) break;
    if (*c && *d != '(') {
      message = "must be name(arguments), try again:"; continue;
    }
    int mod = 0;
    c = f_return_type_input->value();
    message = c_check(c); if (message) continue;
    name(f_name_input->value());
    storestring(c, return_type);
    if (is_in_class()) {
      if (public_ != f_public_member_choice->value()) {
        mod = 1;
        public_ = f_public_member_choice->value();
        redraw_browser();
      }
    } else {
      if (public_ != f_public_choice->value()) {
        mod = 1;
        public_ = f_public_choice->value();
        redraw_browser();
      }
    }
    if (cdecl_ != f_c_button->value()) {
      mod = 1;
      cdecl_ = f_c_button->value();
    }
    c = f_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    if (mod) set_modflag(1);
    break;
  }
BREAK2:
  function_panel->hide();
}